

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gccode.c
# Opt level: O0

int code_block_size(unsigned_long codeblock68k)

{
  uint uVar1;
  InstPtr pBVar2;
  char local_f8 [8];
  char errtext [200];
  fnhead *fnbase;
  uint len;
  uint opnum;
  InstPtr initcodeptr;
  InstPtr codeptr;
  unsigned_long codeblock68k_local;
  
  pBVar2 = (InstPtr)(codeblock68k + (long)(int)(uint)*(ushort *)(codeblock68k + 4));
  errtext._192_8_ = codeblock68k;
  for (initcodeptr = pBVar2; uVar1 = (uint)*(byte *)((ulong)initcodeptr ^ 3),
      *(byte *)((ulong)initcodeptr ^ 3) != 0; initcodeptr = initcodeptr + ((uint)fnbase + 1)) {
    fnbase._0_4_ = oplength[uVar1];
    if (5 < (uint)fnbase) {
      sprintf(local_f8,
              "Unrecognized bytecode (0%o) at offset 0%to in code block x%x,x%x; continue to use UFN length"
              ,(ulong)uVar1,(long)initcodeptr - errtext._192_8_,
              (ulong)((uint)(codeblock68k >> 0x10) & 0xff),(ulong)((uint)codeblock68k & 0xffff));
      error(local_f8);
      fnbase._0_4_ = (uint)(UFNTable[(ulong)uVar1 * 2] >> 8);
      oplength[uVar1] = (uint)fnbase;
    }
  }
  return (int)initcodeptr - (int)pBVar2;
}

Assistant:

int code_block_size(long unsigned int codeblock68k) {
  InstPtr codeptr, initcodeptr;
  unsigned int opnum;
  unsigned int len;
  struct fnhead *fnbase;
  fnbase = (struct fnhead *)codeblock68k;
  initcodeptr = codeptr = ((InstPtr)fnbase) + fnbase->startpc;
  while (T) {
    switch (opnum = Get_BYTE(codeptr)) {
      case ENDOFX: /* -X- */ return (codeptr - initcodeptr);
    }
    if ((len = oplength[opnum]) >
        LONGEST_OPCODE) { /* len > biggest possible marks an unknown opcode */
      char errtext[200];
      sprintf(errtext,
              "Unrecognized bytecode (0%o) at offset 0%to in code block x%x,x%x; continue to use "
              "UFN length",
              opnum, codeptr - (InstPtr)fnbase, (int)((codeblock68k >> 16) & 0xFF), (int)(codeblock68k & 0xFFFF));
      error(errtext);
      oplength[opnum] = len = (((UFN *)UFNTable) + (opnum))->byte_num;
    }
    codeptr += len + 1;
  }
}